

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrcManager.cpp
# Opt level: O1

GdlGlyphClassDefn * __thiscall GrcManager::AddAnonymousClass(GrcManager *this,GrpLineAndFile *lnf)

{
  Symbol this_00;
  GdlGlyphClassDefn *pglfc;
  string local_38;
  
  this_00 = GrcSymbolTable::AddAnonymousClassSymbol(this->m_psymtbl,lnf);
  if (this_00->m_pData == (GdlDefn *)0x0) {
    pglfc = (GdlGlyphClassDefn *)0x0;
  }
  else {
    pglfc = (GdlGlyphClassDefn *)
            __dynamic_cast(this_00->m_pData,&GdlDefn::typeinfo,&GdlGlyphClassDefn::typeinfo,0);
  }
  GdlRenderer::AddGlyphClass(this->m_prndr,pglfc);
  GrcSymbolTableEntry::FieldAt_abi_cxx11_(&local_38,this_00,0);
  std::__cxx11::string::_M_assign((string *)&pglfc->m_staName);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return pglfc;
}

Assistant:

GdlGlyphClassDefn * GrcManager::AddAnonymousClass(GrpLineAndFile const& lnf)
{
	Symbol psymClass = m_psymtbl->AddAnonymousClassSymbol(lnf);
	GdlGlyphClassDefn * pglfc = dynamic_cast<GdlGlyphClassDefn*>(psymClass->Data());
	Assert(pglfc);
	m_prndr->AddGlyphClass(pglfc);
	pglfc->SetName(std::string(psymClass->FieldAt(0)));
	return pglfc;
}